

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_stage,int p_col,int p_row,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val)

{
  pointer pnVar1;
  type_conflict5 tVar2;
  long lVar3;
  long lVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  pointer pnVar7;
  multiprecision *pmVar8;
  byte bVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_228;
  multiprecision local_1a8 [112];
  int local_138;
  undefined1 local_134;
  undefined8 local_130;
  multiprecision local_128 [112];
  int local_b8;
  undefined1 local_b4;
  undefined8 local_b0;
  multiprecision local_a8 [112];
  int local_38;
  undefined1 local_34;
  undefined8 local_30;
  
  bVar9 = 0;
  (this->row).orig[p_stage] = p_row;
  (this->col).orig[p_stage] = p_col;
  (this->row).perm[p_row] = p_stage;
  (this->col).perm[p_col] = p_stage;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_228,1.0,(type *)0x0);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&local_228,&val->m_backend);
  pnVar1 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0x1c;
  pnVar6 = &result;
  pnVar7 = pnVar1 + p_row;
  for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar7->m_backend).data._M_elems[0] = *(undefined4 *)pnVar6;
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
    pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  pnVar1[p_row].m_backend.exp = result.m_backend.exp;
  pnVar1[p_row].m_backend.neg = result.m_backend.neg;
  pnVar1[p_row].m_backend.fpclass = result.m_backend.fpclass;
  pnVar1[p_row].m_backend.prec_elem = result.m_backend.prec_elem;
  pnVar6 = val;
  pmVar8 = local_a8;
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(uint *)pmVar8 = (pnVar6->m_backend).data._M_elems[0];
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
    pmVar8 = pmVar8 + (ulong)bVar9 * -8 + 4;
  }
  local_38 = (val->m_backend).exp;
  local_34 = (val->m_backend).neg;
  local_30._0_4_ = (val->m_backend).fpclass;
  local_30._4_4_ = (val->m_backend).prec_elem;
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result,local_a8,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_a8);
  local_228.data._M_elems._0_8_ =
       Tolerances::epsilonPivot
                 ((this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  tVar2 = boost::multiprecision::operator<(&result,(double *)&local_228);
  if (tVar2) {
    this->stat = SINGULAR;
  }
  pnVar6 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = pnVar6 + p_row;
  pmVar8 = local_128;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(uint *)pmVar8 = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar9 * -2 + 1) * 4);
    pmVar8 = pmVar8 + (ulong)bVar9 * -8 + 4;
  }
  local_b8 = pnVar6[p_row].m_backend.exp;
  local_b4 = pnVar6[p_row].m_backend.neg;
  local_b0._0_4_ = pnVar6[p_row].m_backend.fpclass;
  local_b0._4_4_ = pnVar6[p_row].m_backend.prec_elem;
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result,local_128,pnVar6);
  tVar2 = boost::multiprecision::operator>(&result,&this->maxabs);
  if (tVar2) {
    pnVar6 = (this->diag).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0x1c;
    pnVar5 = pnVar6 + p_row;
    pmVar8 = local_1a8;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(uint *)pmVar8 = (pnVar5->m_backend).data._M_elems[0];
      pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar5 + ((ulong)bVar9 * -2 + 1) * 4);
      pmVar8 = pmVar8 + (ulong)bVar9 * -8 + 4;
    }
    local_138 = pnVar6[p_row].m_backend.exp;
    local_134 = pnVar6[p_row].m_backend.neg;
    local_130._0_4_ = pnVar6[p_row].m_backend.fpclass;
    local_130._4_4_ = pnVar6[p_row].m_backend.prec_elem;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result,local_1a8,pnVar6);
    pnVar6 = &result;
    pnVar5 = &this->maxabs;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar5->m_backend).data._M_elems[0] = *(uint *)pnVar6;
      pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar6 + ((ulong)bVar9 * -2 + 1) * 4);
      pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar5 + (ulong)bVar9 * -8 + 4);
    }
    (this->maxabs).m_backend.exp = result.m_backend.exp;
    (this->maxabs).m_backend.neg = result.m_backend.neg;
    (this->maxabs).m_backend.fpclass = result.m_backend.fpclass;
    (this->maxabs).m_backend.prec_elem = result.m_backend.prec_elem;
  }
  return;
}

Assistant:

void CLUFactor<R>::setPivot(const int p_stage,
                            const int p_col,
                            const int p_row,
                            const R val)
{
   assert(row.perm[p_row] < 0);
   assert(col.perm[p_col] < 0);

   row.orig[p_stage] = p_row;
   col.orig[p_stage] = p_col;
   row.perm[p_row]   = p_stage;
   col.perm[p_col]   = p_stage;
   diag[p_row]       = R(1.0) / val;

   if(spxAbs(val) < _tolerances->epsilonPivot())
   {
#ifndef NDEBUG
      SPX_MSG_ERROR(std::cerr
                    << "LU pivot element is almost zero (< "
                    << _tolerances->epsilonPivot()
                    << ") - Basis is numerically singular"
                    << std::endl;)
#endif
      this->stat = SLinSolver<R>::SINGULAR;
   }

   if(spxAbs(diag[p_row]) > maxabs)
      maxabs = spxAbs(diag[p_row]);
}